

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::GenerateInstallerFile(cmCPackIFWInstaller *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference ppcVar4;
  size_type sVar5;
  ostream *poVar6;
  reference pvVar7;
  string local_c70 [32];
  undefined1 local_c50 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  undefined1 local_ab8 [8];
  string path_7;
  string name_7;
  size_t i;
  cmCPackIFWResourcesParser parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resources;
  string local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  undefined1 local_998 [8];
  string path_6;
  string name_6;
  string local_950;
  allocator local_929;
  string local_928;
  allocator local_901;
  string local_900;
  allocator local_8d9;
  string local_8d8;
  allocator local_8b1;
  string local_8b0;
  allocator local_889;
  string local_888;
  __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
  local_868;
  __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
  local_860;
  iterator rit;
  string local_850;
  allocator local_829;
  string local_828;
  allocator local_801;
  string local_800;
  allocator local_7d9;
  string local_7d8;
  allocator local_7b1;
  string local_7b0;
  allocator local_789;
  string local_788;
  allocator local_761;
  string local_760;
  allocator local_739;
  string local_738;
  allocator local_711;
  string local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  undefined1 local_6d0 [8];
  string path_5;
  string name_5;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  undefined1 local_648 [8];
  string path_4;
  string name_4;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 local_5c0 [8];
  string path_3;
  string name_3;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [8];
  string path_2;
  string name_2;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  string path_1;
  string name_1;
  string local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_408 [8];
  string path;
  string name;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  allocator local_321;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  cmXMLWriter xout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  cmGeneratedFileStream fout;
  cmCPackIFWInstaller *this_local;
  
  fout._576_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)
     ) {
    std::__cxx11::string::operator=
              ((string *)&this->Directory,
               (string *)
               &(((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).toplevel);
  }
  std::operator+(&local_278,&this->Directory,"/config/config.xml");
  pcVar3 = (char *)std::__cxx11::string::data();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_258,pcVar3,false,None)
  ;
  std::__cxx11::string::~string((string *)&local_278);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2d8,(ostream *)local_258,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_2d8,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,(cmXMLWriter *)local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"Installer",&local_2f9);
  cmXMLWriter::StartElement((cmXMLWriter *)local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"Name",&local_321);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2d8,&local_320,&this->Name);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"Version",&local_349);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2d8,&local_348,&this->Version);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"Title",&local_371);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2d8,&local_370,&this->Title);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,"Publisher",&local_399);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2d8,&local_398,&this->Publisher)
    ;
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3c0,"ProductUrl",(allocator *)(name.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_3c0,&this->ProductUrl);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&path.field_2 + 8),&this->InstallerApplicationIcon);
    std::operator+(&local_428,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
                   &local_428,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_428);
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_448,(string *)((long)&path.field_2 + 8));
    std::__cxx11::string::operator=((string *)(path.field_2._M_local_buf + 8),(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerApplicationIcon,(string *)local_408);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_468,"InstallerApplicationIcon",
               (allocator *)(name_1.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_468,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&path_1.field_2 + 8),&this->InstallerWindowIcon);
    std::operator+(&local_4d0,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                   &local_4d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_4d0);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerWindowIcon,(string *)local_4b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4f0,"InstallerWindowIcon",
               (allocator *)(name_2.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_4f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)(name_2.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_2.field_2 + 8),&this->Logo);
    std::operator+(&local_558,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                   &local_558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_558);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Logo,(string *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_578,"Logo",(allocator *)(name_3.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_578,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_538);
    std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_3.field_2 + 8),&this->Banner);
    std::operator+(&local_5e0,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                   &local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_5e0);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Banner,(string *)local_5c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_600,"Banner",(allocator *)(name_4.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_600,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator((allocator<char> *)(name_4.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_5c0);
    std::__cxx11::string::~string((string *)(path_3.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_4.field_2 + 8),&this->Watermark);
    std::operator+(&local_668,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648,
                   &local_668,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_4.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_668);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Watermark,(string *)local_648);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_688,"Watermark",(allocator *)(name_5.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_688,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_4.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)(name_5.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_648);
    std::__cxx11::string::~string((string *)(path_4.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_5.field_2 + 8),&this->Background);
    std::operator+(&local_6f0,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0,
                   &local_6f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_5.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_6f0);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Background,(string *)local_6d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_710,"Background",&local_711);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_710,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_5.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    std::__cxx11::string::~string((string *)local_6d0);
    std::__cxx11::string::~string((string *)(path_5.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_738,"WizardStyle",&local_739);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_738,&this->WizardStyle);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator((allocator<char> *)&local_739);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_760,"WizardDefaultWidth",&local_761);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_760,&this->WizardDefaultWidth);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_788,"WizardDefaultHeight",&local_789);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_788,&this->WizardDefaultHeight);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator((allocator<char> *)&local_789);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b0,"TitleColor",&local_7b1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_7b0,&this->TitleColor);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7d8,"StartMenuDir",&local_7d9);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_7d8,&this->StartMenuDir);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_800,"TargetDir",&local_801);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2d8,&local_800,&this->TargetDir)
    ;
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator((allocator<char> *)&local_801);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_828,"AdminTargetDir",&local_829);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_828,&this->AdminTargetDir);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_829);
  }
  bVar1 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                    (&this->RemoteRepositories);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_850,"RemoteRepositories",(allocator *)((long)&rit._M_current + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_2d8,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rit._M_current + 7));
    local_860._M_current =
         (cmCPackIFWRepository **)
         std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::begin
                   (&this->RemoteRepositories);
    while( true ) {
      local_868._M_current =
           (cmCPackIFWRepository **)
           std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::end
                     (&this->RemoteRepositories);
      bVar1 = __gnu_cxx::operator!=(&local_860,&local_868);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                ::operator*(&local_860);
      cmCPackIFWRepository::WriteRepositoryConfig(*ppcVar4,(cmXMLWriter *)local_2d8);
      __gnu_cxx::
      __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
      ::operator++(&local_860);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2d8);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_888,"MaintenanceToolName",&local_889);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_888,&this->MaintenanceToolName);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8b0,"MaintenanceToolIniFile",&local_8b1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_8b0,&this->MaintenanceToolIniFile);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (bVar1) {
    cmXMLWriter::Comment((cmXMLWriter *)local_2d8,"CPack IFW default policy for QtIFW less 2.0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8d8,"AllowNonAsciiCharacters",&local_8d9);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2d8,&local_8d8,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_900,"AllowSpaceInPath",&local_901);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2d8,&local_900,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_928,"AllowNonAsciiCharacters",&local_929);
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_2d8,&local_928,&this->AllowNonAsciiCharacters);
      std::__cxx11::string::~string((string *)&local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_950,"AllowSpaceInPath",
                 (allocator *)(name_6.field_2._M_local_buf + 0xf));
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_2d8,&local_950,&this->AllowSpaceInPath);
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator((allocator<char> *)(name_6.field_2._M_local_buf + 0xf));
    }
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_6.field_2 + 8),&this->ControlScript);
    std::operator+(&local_9b8,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_998,
                   &local_9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_6.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_9b8);
    cmsys::SystemTools::CopyFileIfDifferent(&this->ControlScript,(string *)local_998);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9d8,"ControlScript",
               (allocator *)
               ((long)&resources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2d8,&local_9d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_6.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&resources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)local_998);
    std::__cxx11::string::~string((string *)(path_6.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Resources);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&parser.basePath.field_2 + 8));
    cmCPackIFWResourcesParser::cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&i,this);
    for (name_7.field_2._8_8_ = 0;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->Resources), (ulong)name_7.field_2._8_8_ < sVar5;
        name_7.field_2._8_8_ = name_7.field_2._8_8_ + 1) {
      bVar1 = cmCPackIFWResourcesParser::ParseResource
                        ((cmCPackIFWResourcesParser *)&i,name_7.field_2._8_8_);
      if (bVar1) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        cmsys::SystemTools::GetFilenameName((string *)((long)&path_7.field_2 + 8),pvVar7);
        std::operator+(&local_ad8,&this->Directory,"/resources/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ab8,&local_ad8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&path_7.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_ad8);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        cmsys::SystemTools::CopyFileIfDifferent(pvVar7,(string *)local_ab8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&parser.basePath.field_2 + 8),
                    (value_type *)((long)&path_7.field_2 + 8));
        std::__cxx11::string::~string((string *)local_ab8);
        std::__cxx11::string::~string((string *)(path_7.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c50);
        poVar6 = std::operator<<((ostream *)local_c50,"Can\'t copy resources from \"");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        poVar6 = std::operator<<(poVar6,(string *)pvVar7);
        poVar6 = std::operator<<(poVar6,"\". Resource will be skipped.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(this_00,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                          ,0x1ce,pcVar3);
          std::__cxx11::string::~string(local_c70);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c50);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->Resources,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&parser.basePath.field_2 + 8));
    cmCPackIFWResourcesParser::~cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&parser.basePath.field_2 + 8));
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_2d8);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_2d8);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2d8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  return;
}

Assistant:

void cmCPackIFWInstaller::GenerateInstallerFile()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Output stream
  cmGeneratedFileStream fout((this->Directory + "/config/config.xml").data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Installer");

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);
  xout.Element("Title", this->Title);

  if (!this->Publisher.empty()) {
    xout.Element("Publisher", this->Publisher);
  }

  if (!this->ProductUrl.empty()) {
    xout.Element("ProductUrl", this->ProductUrl);
  }

  // ApplicationIcon
  if (!this->InstallerApplicationIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerApplicationIcon);
    std::string path = this->Directory + "/config/" + name;
    name = cmSystemTools::GetFilenameWithoutExtension(name);
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerApplicationIcon,
                                            path);
    xout.Element("InstallerApplicationIcon", name);
  }

  // WindowIcon
  if (!this->InstallerWindowIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerWindowIcon);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerWindowIcon, path);
    xout.Element("InstallerWindowIcon", name);
  }

  // Logo
  if (!this->Logo.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Logo);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Logo, path);
    xout.Element("Logo", name);
  }

  // Banner
  if (!this->Banner.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Banner);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Banner, path);
    xout.Element("Banner", name);
  }

  // Watermark
  if (!this->Watermark.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Watermark);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Watermark, path);
    xout.Element("Watermark", name);
  }

  // Background
  if (!this->Background.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Background);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Background, path);
    xout.Element("Background", name);
  }

  // WizardStyle
  if (!this->WizardStyle.empty()) {
    xout.Element("WizardStyle", this->WizardStyle);
  }

  // WizardDefaultWidth
  if (!this->WizardDefaultWidth.empty()) {
    xout.Element("WizardDefaultWidth", this->WizardDefaultWidth);
  }

  // WizardDefaultHeight
  if (!this->WizardDefaultHeight.empty()) {
    xout.Element("WizardDefaultHeight", this->WizardDefaultHeight);
  }

  // TitleColor
  if (!this->TitleColor.empty()) {
    xout.Element("TitleColor", this->TitleColor);
  }

  // Start menu
  if (!this->IsVersionLess("2.0")) {
    xout.Element("StartMenuDir", this->StartMenuDir);
  }

  // Target dir
  if (!this->TargetDir.empty()) {
    xout.Element("TargetDir", this->TargetDir);
  }

  // Admin target dir
  if (!this->AdminTargetDir.empty()) {
    xout.Element("AdminTargetDir", this->AdminTargetDir);
  }

  // Remote repositories
  if (!this->RemoteRepositories.empty()) {
    xout.StartElement("RemoteRepositories");
    for (RepositoriesVector::iterator rit = this->RemoteRepositories.begin();
         rit != this->RemoteRepositories.end(); ++rit) {
      (*rit)->WriteRepositoryConfig(xout);
    }
    xout.EndElement();
  }

  // Maintenance tool
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolName.empty()) {
    xout.Element("MaintenanceToolName", this->MaintenanceToolName);
  }

  // Maintenance tool ini file
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolIniFile.empty()) {
    xout.Element("MaintenanceToolIniFile", this->MaintenanceToolIniFile);
  }

  // Different allows
  if (this->IsVersionLess("2.0")) {
    // CPack IFW default policy
    xout.Comment("CPack IFW default policy for QtIFW less 2.0");
    xout.Element("AllowNonAsciiCharacters", "true");
    xout.Element("AllowSpaceInPath", "true");
  } else {
    if (!this->AllowNonAsciiCharacters.empty()) {
      xout.Element("AllowNonAsciiCharacters", this->AllowNonAsciiCharacters);
    }
    if (!this->AllowSpaceInPath.empty()) {
      xout.Element("AllowSpaceInPath", this->AllowSpaceInPath);
    }
  }

  // Control script (copy to config dir)
  if (!this->IsVersionLess("2.0") && !this->ControlScript.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->ControlScript);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->ControlScript, path);
    xout.Element("ControlScript", name);
  }

  // Resources (copy to resources dir)
  if (!this->Resources.empty()) {
    std::vector<std::string> resources;
    cmCPackIFWResourcesParser parser(this);
    for (size_t i = 0; i < this->Resources.size(); i++) {
      if (parser.ParseResource(i)) {
        std::string name = cmSystemTools::GetFilenameName(this->Resources[i]);
        std::string path = this->Directory + "/resources/" + name;
        cmsys::SystemTools::CopyFileIfDifferent(this->Resources[i], path);
        resources.push_back(name);
      } else {
        cmCPackIFWLogger(WARNING, "Can't copy resources from \""
                           << this->Resources[i]
                           << "\". Resource will be skipped." << std::endl);
      }
    }
    this->Resources = resources;
  }

  xout.EndElement();
  xout.EndDocument();
}